

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_b4327e::AddAuthorityKeyIdentifier
          (anon_unknown_dwarf_b4327e *this,X509_CRL *crl,Span<const_unsigned_char> key_id)

{
  int iVar1;
  ASN1_OCTET_STRING *pAVar2;
  bool bVar3;
  UniquePtr<AUTHORITY_KEYID> akid;
  _Head_base<0UL,_AUTHORITY_KEYID_st_*,_false> local_20;
  
  local_20._M_head_impl = (AUTHORITY_KEYID_st *)AUTHORITY_KEYID_new();
  if (local_20._M_head_impl != (AUTHORITY_KEYID_st *)0x0) {
    pAVar2 = ASN1_OCTET_STRING_new();
    (local_20._M_head_impl)->keyid = (ASN1_OCTET_STRING *)pAVar2;
    if ((ASN1_STRING *)(local_20._M_head_impl)->keyid != (ASN1_STRING *)0x0) {
      iVar1 = ASN1_STRING_set((ASN1_STRING *)(local_20._M_head_impl)->keyid,crl,(int)key_id.data_);
      if (iVar1 != 0) {
        iVar1 = X509_CRL_add1_ext_i2d((X509_CRL *)this,0x5a,local_20._M_head_impl,0,0);
        bVar3 = iVar1 != 0;
        goto LAB_00424982;
      }
    }
  }
  bVar3 = false;
LAB_00424982:
  std::unique_ptr<AUTHORITY_KEYID_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<AUTHORITY_KEYID_st,_bssl::internal::Deleter> *)&local_20);
  return bVar3;
}

Assistant:

static bool AddAuthorityKeyIdentifier(X509_CRL *crl,
                                      bssl::Span<const uint8_t> key_id) {
  bssl::UniquePtr<AUTHORITY_KEYID> akid(AUTHORITY_KEYID_new());
  if (akid == nullptr) {
    return false;
  }
  akid->keyid = ASN1_OCTET_STRING_new();
  if (akid->keyid == nullptr ||
      !ASN1_STRING_set(akid->keyid, key_id.data(), key_id.size()) ||
      !X509_CRL_add1_ext_i2d(crl, NID_authority_key_identifier, akid.get(),
                             /*crit=*/0, /*flags=*/0)) {
    return false;
  }
  return true;
}